

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O0

aom_metadata_t *
aom_img_metadata_alloc
          (uint32_t type,uint8_t *data,size_t sz,aom_metadata_insert_flags_t insert_flag)

{
  uint8_t *puVar1;
  aom_metadata_insert_flags_t in_ECX;
  size_t in_RDX;
  void *in_RSI;
  uint32_t in_EDI;
  aom_metadata_t *metadata;
  aom_metadata_t *local_8;
  
  if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
    local_8 = (aom_metadata_t *)0x0;
  }
  else {
    local_8 = (aom_metadata_t *)malloc(0x20);
    if (local_8 == (aom_metadata_t *)0x0) {
      local_8 = (aom_metadata_t *)0x0;
    }
    else {
      local_8->type = in_EDI;
      puVar1 = (uint8_t *)malloc(in_RDX);
      local_8->payload = puVar1;
      if (local_8->payload == (uint8_t *)0x0) {
        free(local_8);
        local_8 = (aom_metadata_t *)0x0;
      }
      else {
        memcpy(local_8->payload,in_RSI,in_RDX);
        local_8->sz = in_RDX;
        local_8->insert_flag = in_ECX;
      }
    }
  }
  return local_8;
}

Assistant:

aom_metadata_t *aom_img_metadata_alloc(
    uint32_t type, const uint8_t *data, size_t sz,
    aom_metadata_insert_flags_t insert_flag) {
  if (!data || sz == 0) return NULL;
  aom_metadata_t *metadata = (aom_metadata_t *)malloc(sizeof(aom_metadata_t));
  if (!metadata) return NULL;
  metadata->type = type;
  metadata->payload = (uint8_t *)malloc(sz);
  if (!metadata->payload) {
    free(metadata);
    return NULL;
  }
  memcpy(metadata->payload, data, sz);
  metadata->sz = sz;
  metadata->insert_flag = insert_flag;
  return metadata;
}